

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O1

lzma_ret lzma_block_header_encode(lzma_block *block,uint8_t *out)

{
  long *plVar1;
  lzma_ret lVar2;
  uint32_t uVar3;
  lzma_vli lVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  size_t out_pos;
  size_t local_38;
  ulong out_size;
  
  lVar4 = lzma_block_unpadded_size(block);
  lVar2 = LZMA_PROG_ERROR;
  if ((lVar4 != 0) && (-2 < (long)block->uncompressed_size)) {
    uVar7 = block->header_size - 4;
    out_size = (ulong)uVar7;
    *out = (uint8_t)(uVar7 >> 2);
    out[1] = '\0';
    local_38 = 2;
    if (block->compressed_size != 0xffffffffffffffff) {
      lVar2 = lzma_vli_encode(block->compressed_size,(size_t *)0x0,out,&local_38,out_size);
      if (lVar2 != LZMA_OK) {
        return lVar2;
      }
      out[1] = out[1] | 0x40;
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      lVar2 = lzma_vli_encode(block->uncompressed_size,(size_t *)0x0,out,&local_38,out_size);
      if (lVar2 != LZMA_OK) {
        return lVar2;
      }
      out[1] = out[1] | 0x80;
    }
    if ((block->filters == (lzma_filter *)0x0) || (block->filters->id == 0xffffffffffffffff)) {
LAB_006257b1:
      lVar2 = LZMA_PROG_ERROR;
    }
    else {
      bVar6 = 0xff;
      lVar5 = 0;
      do {
        if (lVar5 == 0x40) goto LAB_006257b1;
        lVar2 = lzma_filter_flags_encode
                          ((lzma_filter *)((long)&block->filters->id + lVar5),out,&local_38,out_size
                          );
        if (lVar2 != LZMA_OK) {
          return lVar2;
        }
        bVar6 = bVar6 + 1;
        plVar1 = (long *)((long)&block->filters[1].id + lVar5);
        lVar5 = lVar5 + 0x10;
      } while (*plVar1 != -1);
      out[1] = out[1] | bVar6;
      lVar2 = LZMA_OK;
      memset(out + local_38,0,out_size - local_38);
      uVar3 = lzma_crc32(out,out_size,0);
      *(uint32_t *)(out + out_size) = uVar3;
    }
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_encode(const lzma_block *block, uint8_t *out)
{
	// Validate everything but filters.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Indicate the size of the buffer _excluding_ the CRC32 field.
	const size_t out_size = block->header_size - 4;

	// Store the Block Header Size.
	out[0] = out_size / 4;

	// We write Block Flags in pieces.
	out[1] = 0x00;
	size_t out_pos = 2;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->compressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x40;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->uncompressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x80;
	}

	// Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	size_t filter_count = 0;
	do {
		// There can be a maximum of four filters.
		if (filter_count == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_encode(
				block->filters + filter_count,
				out, &out_pos, out_size));

	} while (block->filters[++filter_count].id != LZMA_VLI_UNKNOWN);

	out[1] |= filter_count - 1;

	// Padding
	memzero(out + out_pos, out_size - out_pos);

	// CRC32
	write32le(out + out_size, lzma_crc32(out, out_size, 0));

	return LZMA_OK;
}